

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

int testing::internal::GetParamIndex(char **param_names,string *param_name)

{
  bool bVar1;
  int iVar2;
  int i;
  long lVar3;
  
  bVar1 = std::operator==(param_name,"*");
  if (bVar1) {
    iVar2 = -1;
  }
  else {
    iVar2 = -3;
    for (lVar3 = 0; param_names[lVar3] != (char *)0x0; lVar3 = lVar3 + 1) {
      bVar1 = std::operator==(param_name,param_names[lVar3]);
      if (bVar1) {
        return (int)lVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

int GetParamIndex(const char* param_names[], const string& param_name) {
  if (param_name == "*")
    return kTupleInterpolation;

  for (int i = 0; param_names[i] != NULL; i++) {
    if (param_name == param_names[i])
      return i;
  }
  return kInvalidInterpolation;
}